

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<int,_4UL>_> *value)

{
  bool bVar1;
  int4 v;
  array<int,_4UL> local_20;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<int,4ul>(this,&local_20);
    if (bVar1) {
      *(undefined8 *)&value->contained = local_20._M_elems._0_8_;
      *(undefined8 *)((long)&value->contained + 8) = local_20._M_elems._8_8_;
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::int4> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::int4 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}